

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

bool __thiscall
SQCompilation::CheckerVisitor::hasDynamicContent(CheckerVisitor *this,SQObject *container)

{
  bool bVar1;
  SQObjectPtr val;
  SQObjectPtr key;
  
  if (container->_type == OT_TABLE) {
    SQObjectPtr::SQObjectPtr(&key,this->_ctx->_vm,"__dynamic_content__",-1);
    val.super_SQObject._unVal.pTable = (SQTable *)0x0;
    val.super_SQObject._type = OT_NULL;
    val.super_SQObject._flags = '\0';
    val.super_SQObject._5_3_ = 0;
    bVar1 = SQTable::Get((container->_unVal).pTable,&key,&val);
    SQObjectPtr::~SQObjectPtr(&val);
    SQObjectPtr::~SQObjectPtr(&key);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CheckerVisitor::hasDynamicContent(const SQObject &container) {
  if (!sq_istable(container))
    return false;
  SQObjectPtr key(_ctx.getVm(), "__dynamic_content__");
  SQObjectPtr val;
  return _table(container)->Get(key, val);
}